

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

int lws_h2_parse_end_of_frame(lws *wsi)

{
  undefined1 *puVar1;
  lws_tx_credit *txc;
  byte bVar2;
  uint8_t uVar3;
  lws_h2_netconn *plVar4;
  lws *wsi_00;
  allocated_headers *paVar5;
  uint32_t uVar6;
  lws_h2_states lVar7;
  int iVar8;
  int iVar9;
  lws *plVar10;
  lws_h2_protocol_send *plVar11;
  lws_filepos_t lVar12;
  uchar *puVar13;
  uint uVar14;
  ulong uVar15;
  char *pcVar16;
  int n;
  uint uVar17;
  lws_token_indexes token;
  long lVar18;
  lws **pplVar19;
  byte *pbVar20;
  char buf [256];
  
  plVar4 = (wsi->h2).h2n;
  plVar4->frame_state = '\0';
  plVar4->count = 0;
  if (plVar4->sid == 0) {
    uVar15 = 0;
  }
  else {
    plVar10 = lws_wsi_mux_from_id(wsi,plVar4->sid);
    plVar4->swsi = plVar10;
    uVar14 = plVar4->sid;
    uVar15 = (ulong)uVar14;
    if (plVar4->highest_sid < uVar14) {
      plVar4->highest_sid = uVar14;
    }
  }
  if (((char)*(ushort *)&plVar4->field_0xa8 < '\0') && ((plVar4->dep & 0x7fffffff) == (uint)uVar15))
  {
    pcVar16 = "depends on own sid";
LAB_0012c224:
    uVar6 = 1;
LAB_0012c226:
    lws_h2_goaway(wsi,uVar6,pcVar16);
    return 0;
  }
  iVar9 = 0;
  switch((ulong)plVar4->type) {
  case 0:
    iVar9 = 0;
    _lws_log(8,"%s: DATA flags 0x%x\n","lws_h2_parse_end_of_frame",(ulong)plVar4->flags);
    if (plVar4->swsi == (lws *)0x0) {
      return 0;
    }
    iVar8 = lws_hdr_total_length(plVar4->swsi,WSI_TOKEN_HTTP_CONTENT_LENGTH);
    plVar10 = plVar4->swsi;
    bVar2 = (plVar10->h2).field_0x11;
    if (iVar8 == 0) {
      if ((bVar2 & 1) != 0) goto LAB_0012c7f7;
    }
    else if ((bVar2 & 1) != 0) {
      if (((plVar10->http).rx_content_length != 0) && ((plVar10->http).rx_content_remain != 0)) {
        lws_h2_rst_stream(plVar10,1,"Not enough rx content");
        return 0;
      }
LAB_0012c7f7:
      if ((plVar10->h2).h2_state == '\x03') {
        lws_h2_state(plVar10,LWS_H2_STATE_HALF_CLOSED_REMOTE);
        plVar10 = plVar4->swsi;
        if (((plVar10->h2).field_0x11 & 1) == 0) goto LAB_0012c836;
      }
      if ((plVar10->h2).h2_state == '\x05') {
        lws_h2_state(plVar10,LWS_H2_STATE_CLOSED);
        plVar10 = plVar4->swsi;
      }
    }
LAB_0012c836:
    if (((plVar10->field_0x2e2 & 0x80) != 0) && ((plVar4->flags & 1) != 0)) {
      iVar9 = 0;
      _lws_log(8,"%s: %p: DATA: end stream\n","lws_h2_parse_end_of_frame");
      plVar10 = plVar4->swsi;
      if ((plVar10->h2).h2_state == '\x03') {
        lws_h2_state(plVar10,LWS_H2_STATE_HALF_CLOSED_REMOTE);
        plVar10 = plVar4->swsi;
      }
      lws_h2_state(plVar10,LWS_H2_STATE_CLOSED);
      lws_h2_rst_stream(plVar4->swsi,0,"client done");
      iVar8 = lws_http_transaction_completed_client(plVar4->swsi);
      if (iVar8 != 0) {
        iVar9 = 0;
        _lws_log(0x10,"tx completed returned close\n");
      }
    }
    break;
  case 1:
  case 9:
    plVar10 = plVar4->swsi;
    if (plVar10 == (lws *)0x0) {
      return 0;
    }
    if ((*(ushort *)&plVar4->field_0xa8 >> 10 & 1) == 0) {
      if (((plVar10->h2).field_0x11 & 2) == 0) {
        _lws_log(8,"witholding http action for continuation\n");
        plVar4->cont_exp_sid = plVar4->sid;
        plVar4->field_0xa8 = plVar4->field_0xa8 | 8;
        return 0;
      }
      if (plVar4->hpack == HPKS_TYPE) {
        uVar3 = (plVar10->h2).h2_state;
        if (uVar3 == '\0') {
          lVar7 = LWS_H2_STATE_OPEN;
LAB_0012c955:
          lws_h2_state(plVar10,lVar7);
        }
        else if (uVar3 == '\x02') {
          lVar7 = LWS_H2_STATE_HALF_CLOSED_LOCAL;
          goto LAB_0012c955;
        }
        _lws_log(8,"http req, wsi=%p, h2n->swsi=%p\n",wsi,plVar4->swsi);
        puVar1 = &plVar4->swsi->field_0x2dc;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 1;
        plVar10 = plVar4->swsi;
        if ((plVar10->field_0x2e2 & 0x80) != 0) {
          iVar9 = lws_client_interpret_server_handshake(plVar10);
          if (iVar9 != 0) {
            pcVar16 = "%s: cli int serv hs closed it\n";
            goto LAB_0012cb60;
          }
          plVar10 = plVar4->swsi;
        }
        iVar9 = lws_hdr_extant(plVar10,WSI_TOKEN_HTTP_CONTENT_LENGTH);
        if (iVar9 != 0) {
          pcVar16 = lws_hdr_simple_ptr(plVar4->swsi,WSI_TOKEN_HTTP_CONTENT_LENGTH);
          lVar12 = atoll(pcVar16);
          plVar10 = plVar4->swsi;
          (plVar10->http).rx_content_length = lVar12;
          (plVar10->http).rx_content_remain = lVar12;
          _lws_log(8,"setting rx_content_length %lld\n",lVar12);
        }
        token = WSI_TOKEN_GET_URI;
        while (puVar13 = lws_token_to_string(token), puVar13 != (uchar *)0x0) {
          iVar9 = lws_hdr_total_length(plVar4->swsi,token);
          if (iVar9 < 0x100 && iVar9 != 0) {
            iVar9 = lws_hdr_copy(plVar4->swsi,buf,0x100,token);
            if (iVar9 < 0) {
              _lws_log(8,"    %s !oversize!\n",puVar13);
            }
            else {
              buf[0xff] = '\0';
              _lws_log(8,"    %s = %s\n",puVar13,buf);
            }
          }
          token = token + WSI_TOKEN_POST_URI;
        }
        plVar10 = plVar4->swsi;
        switch((plVar10->h2).h2_state) {
        case '\x03':
          if (((plVar10->h2).field_0x11 & 1) != 0) {
            lVar7 = LWS_H2_STATE_HALF_CLOSED_REMOTE;
LAB_0012cad5:
            lws_h2_state(plVar10,lVar7);
          }
          break;
        case '\x04':
        case '\x06':
          pcVar16 = "Banning service on CLOSED_REMOTE";
          uVar6 = 5;
          goto LAB_0012c226;
        case '\x05':
          if (((plVar10->h2).field_0x11 & 1) != 0) {
            lVar7 = LWS_H2_STATE_CLOSED;
            goto LAB_0012cad5;
          }
        }
        if ((*(ulong *)&plVar4->swsi->field_0x2dc & 0x80000000000000) != 0) {
          pcVar16 = "%s: headers: client path\n";
LAB_0012cb60:
          _lws_log(8,pcVar16,"lws_h2_parse_end_of_frame");
          return 0;
        }
        iVar9 = lws_hdr_total_length(plVar4->swsi,WSI_TOKEN_HTTP_COLON_PATH);
        if ((((iVar9 == 0) ||
             (iVar9 = lws_hdr_total_length(plVar4->swsi,WSI_TOKEN_HTTP_COLON_METHOD), iVar9 == 0))
            || (iVar9 = lws_hdr_total_length(plVar4->swsi,WSI_TOKEN_HTTP_COLON_SCHEME), iVar9 == 0))
           || ((iVar9 = lws_hdr_total_length(plVar4->swsi,WSI_TOKEN_HTTP_COLON_STATUS), iVar9 != 0
               || (iVar9 = lws_hdr_extant(plVar4->swsi,WSI_TOKEN_CONNECTION), iVar9 != 0)))) {
          pcVar16 = "Pseudoheader checks";
          goto LAB_0012c224;
        }
        iVar9 = lws_hdr_extant(plVar4->swsi,WSI_TOKEN_TE);
        if (iVar9 == 0) {
LAB_0012cbdf:
          pcVar16 = lws_hdr_simple_ptr(plVar4->swsi,WSI_TOKEN_HTTP_COLON_METHOD);
          pbVar20 = (byte *)0x13e63f;
          lVar18 = 0;
          do {
            if (lVar18 == 0x20) goto LAB_0012cc3e;
            iVar9 = strcasecmp(pcVar16,(char *)((long)&method_names_rel +
                                               (long)*(int *)((long)&method_names_rel + lVar18)));
            lVar18 = lVar18 + 4;
            pbVar20 = pbVar20 + 1;
          } while (iVar9 != 0);
          paVar5 = (plVar4->swsi->http).ah;
          paVar5->frag_index[*pbVar20] = paVar5->frag_index[0x25];
LAB_0012cc3e:
          _lws_log(0x10,"%s: setting DEF_ACT from 0x%x\n","lws_h2_parse_end_of_frame",
                   (ulong)plVar4->swsi->wsistate);
          lwsi_set_state(plVar4->swsi,0x110);
          plVar10 = plVar4->swsi;
LAB_0012c91b:
          lws_callback_on_writable(plVar10);
          return 0;
        }
        iVar9 = lws_hdr_total_length(plVar4->swsi,WSI_TOKEN_TE);
        if (iVar9 == 8) {
          pcVar16 = lws_hdr_simple_ptr(plVar4->swsi,WSI_TOKEN_TE);
          iVar9 = strncmp(pcVar16,"trailers",8);
          if (iVar9 == 0) goto LAB_0012cbdf;
        }
        pcVar16 = "Illegal transfer-encoding";
        goto LAB_0012c224;
      }
      _lws_log(8,"hpack incomplete %d (type %d, len %u)\n",(ulong)plVar4->hpack,(ulong)plVar4->type,
               (ulong)plVar4->hpack_len);
      pcVar16 = "hpack incomplete";
    }
    else {
      pcVar16 = "dyntable resize last in headers";
    }
    uVar6 = 9;
LAB_0012c7e4:
    lws_h2_goaway(wsi,uVar6,pcVar16);
    return 0;
  case 3:
    iVar9 = 0;
    _lws_log(8,"LWS_H2_FRAME_TYPE_RST_STREAM: sid %u: reason 0x%x\n",uVar15,
             (ulong)plVar4->hpack_e_dep);
    break;
  case 4:
    if ((*(ulong *)&wsi->field_0x2dc & 0x140000000000000) != 0x40000000000000) {
      return 0;
    }
    if ((plVar4->flags & 1) != 0) {
      return 0;
    }
    (wsi->http).fop_fd = (lws_fop_fd_t)0x0;
    _lws_log(8,"%s: migrating\n","lws_h2_parse_end_of_frame");
    wsi->field_0x2e3 = wsi->field_0x2e3 | 1;
    plVar10 = lws_wsi_server_new(wsi->vhost,wsi,1);
    plVar4->swsi = plVar10;
    if (plVar10 == (lws *)0x0) {
      return 1;
    }
    plVar4->sid = 1;
    plVar10 = lws_wsi_mux_from_id(wsi,1);
    if (plVar10 == plVar4->swsi) {
      lws_role_transition(wsi,0x10000000,LRS_H2_WAITING_TO_SEND_HEADERS,&role_ops_h2);
      lws_role_transition(plVar4->swsi,0x10000000,LRS_H2_WAITING_TO_SEND_HEADERS,&role_ops_h2);
      plVar10 = plVar4->swsi;
      (plVar10->http).ah = (wsi->http).ah;
      puVar1 = &plVar10->field_0x2e2;
      *puVar1 = *puVar1 | 0x80;
      plVar10 = plVar4->swsi;
      plVar10->flags = wsi->flags;
      plVar10->protocol = wsi->protocol;
      if ((plVar10->user_space != (void *)0x0) && ((plVar10->field_0x2dd & 8) == 0)) {
        lws_realloc(plVar10->user_space,0,"lws_free");
        plVar10 = plVar4->swsi;
      }
      plVar10->user_space = wsi->user_space;
      *(ulong *)&plVar10->field_0x2dc =
           *(ulong *)&plVar10->field_0x2dc & 0xfffffffffffff7ff |
           (ulong)((uint)*(undefined8 *)&wsi->field_0x2dc & 0x800);
      plVar10 = plVar4->swsi;
      plVar10->opaque_user_data = wsi->opaque_user_data;
      wsi->opaque_user_data = (void *)0x0;
      (plVar10->txc).manual_initial_tx_credit = (wsi->txc).manual_initial_tx_credit;
      wsi->user_space = (void *)0x0;
      paVar5 = (plVar10->http).ah;
      if (paVar5 != (allocated_headers *)0x0) {
        paVar5->wsi = plVar10;
      }
      (wsi->http).ah = (allocated_headers *)0x0;
      _lws_log(8,"%s: MIGRATING nwsi %p: swsi %p\n","lws_h2_parse_end_of_frame",wsi);
      (plVar4->swsi->txc).tx_cr = (plVar4->peer_set).s[4];
      _lws_log(8,"%s: initial tx credit on conn %p: %d\n","lws_h2_parse_end_of_frame");
      puVar1 = &(plVar4->swsi->h2).field_0x11;
      *puVar1 = *puVar1 | 0x10;
      if (((wsi->h2).field_0x11 & 0x10) == 0) {
        (wsi->txc).tx_cr = (plVar4->peer_set).s[4];
        _lws_log(8,"%s: initial tx credit for us to write on master %p: %d\n",
                 "lws_h2_parse_end_of_frame",wsi);
        puVar1 = &(wsi->h2).field_0x11;
        *puVar1 = *puVar1 | 0x10;
      }
      lws_callback_on_writable(plVar4->swsi);
      if (((wsi->field_0x2dc & 0x40) == 0) || ((wsi->flags & 0x20) == 0)) {
        plVar11 = lws_h2_new_pps(LWS_H2_PPS_ACK_SETTINGS);
        if (plVar11 == (lws_h2_protocol_send *)0x0) {
          return 1;
        }
        lws_pps_schedule(wsi,plVar11);
        _lws_log(8,"%s: SETTINGS ack PPS\n","lws_h2_parse_end_of_frame");
        wsi->field_0x2dc = wsi->field_0x2dc | 0x40;
      }
      lws_wsi_mux_apply_queue(wsi);
      return 0;
    }
    __assert_fail("lws_wsi_mux_from_id(wsi, 1) == h2n->swsi",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/h2/http2.c"
                  ,0x56b,"int lws_h2_parse_end_of_frame(struct lws *)");
  case 6:
    if ((plVar4->flags & 1) != 0) {
      lws_validity_confirmed(wsi);
      return 0;
    }
    plVar11 = lws_h2_new_pps(LWS_H2_PPS_PONG);
    if (plVar11 != (lws_h2_protocol_send *)0x0) {
      _lws_log(8,"rx ping, preparing pong\n");
      (plVar11->u).rs = *(anon_struct_8_2_43e7303c_for_rs *)plVar4->ping_payload;
      lws_pps_schedule(wsi,plVar11);
      return 0;
    }
    goto LAB_0012c3a2;
  case 7:
    _lws_log(4,"GOAWAY: last sid %u, error 0x%08X, string \'%s\'\n",(ulong)plVar4->goaway_last_sid,
             (ulong)plVar4->goaway_err,plVar4->goaway_str);
LAB_0012c3a2:
    iVar9 = 1;
    break;
  case 8:
    uVar14 = plVar4->hpack_e_dep & 0x7fffffff;
    plVar4->hpack_e_dep = uVar14;
    _lws_log(8,"WINDOW_UPDATE: sid %u %u (0x%x)\n",uVar15,(ulong)uVar14,(ulong)uVar14);
    uVar14 = plVar4->sid;
    plVar10 = wsi;
    if ((uVar14 != 0) && (plVar10 = plVar4->swsi, plVar10 == (lws *)0x0)) {
      if (uVar14 <= plVar4->highest_sid_opened) {
        return 0;
      }
      pcVar16 = "alien sid";
      uVar6 = 1;
      goto LAB_0012c7e4;
    }
    if ((plVar10->vhost->options & 0x80000000) == 0) {
      uVar15 = (ulong)plVar4->hpack_e_dep;
      uVar17 = (plVar10->txc).tx_cr;
      lVar18 = (long)(int)uVar17;
    }
    else {
      uVar17 = (plVar10->txc).tx_cr;
      lVar18 = (long)(int)uVar17;
      uVar15 = (ulong)plVar4->hpack_e_dep;
      if (uVar15 + lVar18 >> 0x1f != 0) {
        uVar15 = (ulong)(uVar17 ^ 0x7fffffff);
        plVar4->hpack_e_dep = uVar17 ^ 0x7fffffff;
      }
    }
    iVar9 = (int)uVar15;
    if (uVar15 + lVar18 >> 0x1f != 0) {
      if (uVar14 != 0) {
        lws_h2_rst_stream(plVar4->swsi,3,"Flow control exceeded max");
        return 0;
      }
      pcVar16 = "Flow control exceeded max";
      uVar6 = 3;
      goto LAB_0012c226;
    }
    if (iVar9 != 0) {
      txc = &plVar10->txc;
      (plVar10->txc).tx_cr = uVar17 + iVar9;
      lws_wsi_txc_report_manual_txcr_in(plVar10,iVar9);
      lws_wsi_txc_describe(txc,"WINDOW_UPDATE in",(plVar10->mux).my_sid);
      if (((int)uVar17 < 1) && (txc->tx_cr < 1)) {
        return 0;
      }
      pplVar19 = &(wsi->mux).child_list;
      while (wsi_00 = *pplVar19, wsi_00 != (lws *)0x0) {
        lws_callback_on_writable(wsi_00);
        pplVar19 = &(wsi_00->mux).sibling_list;
      }
      if ((plVar10->txc).skint == '\0') {
        return 0;
      }
      iVar9 = lws_h2_tx_cr_get(plVar10);
      iVar9 = lws_wsi_txc_check_skint(txc,iVar9);
      if (iVar9 != 0) {
        return 0;
      }
      goto LAB_0012c91b;
    }
    pcVar16 = "Zero length window update";
    goto LAB_0012c224;
  }
  return iVar9;
}

Assistant:

static int
lws_h2_parse_end_of_frame(struct lws *wsi)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws *eff_wsi = wsi;
	const char *p;
	int n;

	h2n->frame_state = 0;
	h2n->count = 0;

	if (h2n->sid)
		h2n->swsi = lws_wsi_mux_from_id(wsi, h2n->sid);

	if (h2n->sid > h2n->highest_sid)
		h2n->highest_sid = h2n->sid;

	if (h2n->collected_priority && (h2n->dep & ~(1u << 31)) == h2n->sid) {
		lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR, "depends on own sid");
		return 0;
	}

	switch (h2n->type) {

	case LWS_H2_FRAME_TYPE_SETTINGS:

#if defined(LWS_WITH_CLIENT)
		if (wsi->client_h2_alpn && !wsi->client_mux_migrated &&
		    !(h2n->flags & LWS_H2_FLAG_SETTINGS_ACK)) {
			struct lws_h2_protocol_send *pps;

			/* migrate original client ask on to substream 1 */
#if defined(LWS_WITH_FILE_OPS)
			wsi->http.fop_fd = NULL;
#endif
			lwsl_info("%s: migrating\n", __func__);
			wsi->client_mux_migrated = 1;
			/*
			 * we need to treat the headers from the upgrade as the
			 * first job.  So these need to get shifted to sid 1.
			 */
			h2n->swsi = lws_wsi_server_new(wsi->vhost, wsi, 1);
			if (!h2n->swsi)
				return 1;
			h2n->sid = 1;

			assert(lws_wsi_mux_from_id(wsi, 1) == h2n->swsi);

			lws_role_transition(wsi, LWSIFR_CLIENT,
					    LRS_H2_WAITING_TO_SEND_HEADERS,
					    &role_ops_h2);

			lws_role_transition(h2n->swsi, LWSIFR_CLIENT,
					    LRS_H2_WAITING_TO_SEND_HEADERS,
					    &role_ops_h2);

			/* pass on the initial headers to SID 1 */
			h2n->swsi->http.ah = wsi->http.ah;
			h2n->swsi->client_mux_substream = 1;
#if defined(LWS_WITH_CLIENT)
			h2n->swsi->flags = wsi->flags;
#endif

			h2n->swsi->protocol = wsi->protocol;
			if (h2n->swsi->user_space &&
			    !h2n->swsi->user_space_externally_allocated)
				lws_free(h2n->swsi->user_space);
			h2n->swsi->user_space = wsi->user_space;
			h2n->swsi->user_space_externally_allocated =
					wsi->user_space_externally_allocated;
			h2n->swsi->opaque_user_data = wsi->opaque_user_data;
			wsi->opaque_user_data = NULL;
			h2n->swsi->txc.manual_initial_tx_credit =
					wsi->txc.manual_initial_tx_credit;

			wsi->user_space = NULL;

			if (h2n->swsi->http.ah)
				h2n->swsi->http.ah->wsi = h2n->swsi;
			wsi->http.ah = NULL;

			lwsl_info("%s: MIGRATING nwsi %p: swsi %p\n", __func__,
				  wsi, h2n->swsi);
			h2n->swsi->txc.tx_cr =
				h2n->peer_set.s[H2SET_INITIAL_WINDOW_SIZE];
			lwsl_info("%s: initial tx credit on conn %p: %d\n",
				  __func__, h2n->swsi, (int)h2n->swsi->txc.tx_cr);
			h2n->swsi->h2.initialized = 1;

			/* set our initial window size */
			if (!wsi->h2.initialized) {
				wsi->txc.tx_cr =
				     h2n->peer_set.s[H2SET_INITIAL_WINDOW_SIZE];

				lwsl_info("%s: initial tx credit for us to "
					  "write on master %p: %d\n", __func__,
					  wsi, (int)wsi->txc.tx_cr);
				wsi->h2.initialized = 1;
			}

			lws_callback_on_writable(h2n->swsi);

			if (!wsi->h2_acked_settings ||
			    !(wsi->flags & LCCSCF_H2_QUIRK_NGHTTP2_END_STREAM)
			) {
				pps = lws_h2_new_pps(LWS_H2_PPS_ACK_SETTINGS);
				if (!pps)
					return 1;
				lws_pps_schedule(wsi, pps);
				lwsl_info("%s: SETTINGS ack PPS\n", __func__);
				wsi->h2_acked_settings = 1;
			}

			/* also attach any queued guys */

			lws_wsi_mux_apply_queue(wsi);
		}
#endif
		break;

	case LWS_H2_FRAME_TYPE_CONTINUATION:
	case LWS_H2_FRAME_TYPE_HEADERS:

		if (!h2n->swsi)
			break;

		/* service the http request itself */

		if (h2n->last_action_dyntable_resize) {
			lws_h2_goaway(wsi, H2_ERR_COMPRESSION_ERROR,
				"dyntable resize last in headers");
			break;
		}

		if (!h2n->swsi->h2.END_HEADERS) {
			/* we are not finished yet */
			lwsl_info("witholding http action for continuation\n");
			h2n->cont_exp_sid = h2n->sid;
			h2n->cont_exp = 1;
			break;
		}

		/* confirm the hpack stream state is reasonable for finishing */

		if (h2n->hpack != HPKS_TYPE) {
			/* hpack incomplete */
			lwsl_info("hpack incomplete %d (type %d, len %u)\n",
				  h2n->hpack, h2n->type,
				  (unsigned int)h2n->hpack_len);
			lws_h2_goaway(wsi, H2_ERR_COMPRESSION_ERROR,
				      "hpack incomplete");
			break;
		}

		/* this is the last part of HEADERS */
		switch (h2n->swsi->h2.h2_state) {
		case LWS_H2_STATE_IDLE:
			lws_h2_state(h2n->swsi, LWS_H2_STATE_OPEN);
			break;
		case LWS_H2_STATE_RESERVED_REMOTE:
			lws_h2_state(h2n->swsi, LWS_H2_STATE_HALF_CLOSED_LOCAL);
			break;
		}

		lwsl_info("http req, wsi=%p, h2n->swsi=%p\n", wsi, h2n->swsi);
		h2n->swsi->hdr_parsing_completed = 1;

#if defined(LWS_WITH_CLIENT)
		if (h2n->swsi->client_mux_substream &&
		    lws_client_interpret_server_handshake(h2n->swsi)) {
			lwsl_info("%s: cli int serv hs closed it\n", __func__);
			break;
		}
#endif

		if (lws_hdr_extant(h2n->swsi, WSI_TOKEN_HTTP_CONTENT_LENGTH)) {
			h2n->swsi->http.rx_content_length  = atoll(
				lws_hdr_simple_ptr(h2n->swsi,
				      WSI_TOKEN_HTTP_CONTENT_LENGTH));
			h2n->swsi->http.rx_content_remain =
					h2n->swsi->http.rx_content_length;
			lwsl_info("setting rx_content_length %lld\n",
				  (long long)h2n->swsi->http.rx_content_length);
		}

		{
			int n = 0, len;
			char buf[256];
			const unsigned char *c;

			do {
				c = lws_token_to_string(n);
				if (!c) {
					n++;
					continue;
				}

				len = lws_hdr_total_length(h2n->swsi, n);
				if (!len || len > (int)sizeof(buf) - 1) {
					n++;
					continue;
				}

				if (lws_hdr_copy(h2n->swsi, buf, sizeof buf,
						 n) < 0) {
					lwsl_info("    %s !oversize!\n",
						  (char *)c);
				} else {
					buf[sizeof(buf) - 1] = '\0';

					lwsl_info("    %s = %s\n",
						  (char *)c, buf);
				}
				n++;
			} while (c);
		}

		if (h2n->swsi->h2.h2_state == LWS_H2_STATE_HALF_CLOSED_REMOTE ||
		    h2n->swsi->h2.h2_state == LWS_H2_STATE_CLOSED) {
			lws_h2_goaway(wsi, H2_ERR_STREAM_CLOSED,
				      "Banning service on CLOSED_REMOTE");
			break;
		}

		switch (h2n->swsi->h2.h2_state) {
		case LWS_H2_STATE_OPEN:
			if (h2n->swsi->h2.END_STREAM)
				lws_h2_state(h2n->swsi,
					     LWS_H2_STATE_HALF_CLOSED_REMOTE);
			break;
		case LWS_H2_STATE_HALF_CLOSED_LOCAL:
			if (h2n->swsi->h2.END_STREAM)
				lws_h2_state(h2n->swsi, LWS_H2_STATE_CLOSED);
			break;
		}

#if defined(LWS_WITH_CLIENT)
		if (h2n->swsi->client_mux_substream) {
			lwsl_info("%s: headers: client path\n", __func__);
			break;
		}
#endif

		if (!lws_hdr_total_length(h2n->swsi, WSI_TOKEN_HTTP_COLON_PATH) ||
		    !lws_hdr_total_length(h2n->swsi, WSI_TOKEN_HTTP_COLON_METHOD) ||
		    !lws_hdr_total_length(h2n->swsi, WSI_TOKEN_HTTP_COLON_SCHEME) ||
		     lws_hdr_total_length(h2n->swsi, WSI_TOKEN_HTTP_COLON_STATUS) ||
		     lws_hdr_extant(h2n->swsi, WSI_TOKEN_CONNECTION)) {
			lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
				      "Pseudoheader checks");
			break;
		}

		if (lws_hdr_extant(h2n->swsi, WSI_TOKEN_TE)) {
			n = lws_hdr_total_length(h2n->swsi, WSI_TOKEN_TE);

			if (n != 8 ||
			    strncmp(lws_hdr_simple_ptr(h2n->swsi, WSI_TOKEN_TE),
				  "trailers", n)) {
				lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
					      "Illegal transfer-encoding");
				break;
			}
		}

#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
		lws_http_compression_validate(h2n->swsi);
#endif

#if defined(LWS_WITH_SERVER_STATUS)
		wsi->vhost->conn_stats.h2_trans++;
#endif
		p = lws_hdr_simple_ptr(h2n->swsi, WSI_TOKEN_HTTP_COLON_METHOD);
		/*
		 * duplicate :path into the individual method uri header
		 * index, so that it looks the same as h1 in the ah
		 */
		for (n = 0; n < (int)LWS_ARRAY_SIZE(method_names); n++)
			if (!strcasecmp(p, method_names[n])) {
				h2n->swsi->http.ah->frag_index[method_index[n]] =
						h2n->swsi->http.ah->frag_index[
				                     WSI_TOKEN_HTTP_COLON_PATH];
				break;
			}

		lwsl_debug("%s: setting DEF_ACT from 0x%x\n", __func__,
			   (unsigned int)h2n->swsi->wsistate);
		lwsi_set_state(h2n->swsi, LRS_DEFERRING_ACTION);
		lws_callback_on_writable(h2n->swsi);
		break;

	case LWS_H2_FRAME_TYPE_DATA:
		lwsl_info("%s: DATA flags 0x%x\n", __func__, h2n->flags);
		if (!h2n->swsi)
			break;

		if (lws_hdr_total_length(h2n->swsi,
					 WSI_TOKEN_HTTP_CONTENT_LENGTH) &&
		    h2n->swsi->h2.END_STREAM &&
		    h2n->swsi->http.rx_content_length &&
		    h2n->swsi->http.rx_content_remain) {
			lws_h2_rst_stream(h2n->swsi, H2_ERR_PROTOCOL_ERROR,
					  "Not enough rx content");
			break;
		}

		if (h2n->swsi->h2.END_STREAM &&
		    h2n->swsi->h2.h2_state == LWS_H2_STATE_OPEN)
			lws_h2_state(h2n->swsi,
				     LWS_H2_STATE_HALF_CLOSED_REMOTE);

		if (h2n->swsi->h2.END_STREAM &&
		    h2n->swsi->h2.h2_state == LWS_H2_STATE_HALF_CLOSED_LOCAL)
			lws_h2_state(h2n->swsi, LWS_H2_STATE_CLOSED);

#if defined(LWS_WITH_CLIENT)
		/*
		 * client... remote END_STREAM implies we weren't going to
		 * send anything else anyway.
		 */

		if (h2n->swsi->client_mux_substream &&
		    (h2n->flags & LWS_H2_FLAG_END_STREAM)) {
			lwsl_info("%s: %p: DATA: end stream\n",
				  __func__, h2n->swsi);

			if (h2n->swsi->h2.h2_state == LWS_H2_STATE_OPEN) {
				lws_h2_state(h2n->swsi,
					     LWS_H2_STATE_HALF_CLOSED_REMOTE);
		//		lws_h2_rst_stream(h2n->swsi, H2_ERR_NO_ERROR,
		//				  "client done");

		//		if (lws_http_transaction_completed_client(h2n->swsi))
		//			lwsl_debug("tx completed returned close\n");
			}

			//if (h2n->swsi->h2.h2_state == LWS_H2_STATE_HALF_CLOSED_LOCAL)
			{
				lws_h2_state(h2n->swsi, LWS_H2_STATE_CLOSED);

				lws_h2_rst_stream(h2n->swsi, H2_ERR_NO_ERROR,
						  "client done");

				if (lws_http_transaction_completed_client(h2n->swsi))
					lwsl_debug("tx completed returned close\n");
			}
		}
#endif
		break;

	case LWS_H2_FRAME_TYPE_PING:
		if (h2n->flags & LWS_H2_FLAG_SETTINGS_ACK)
			lws_validity_confirmed(wsi);
		else {
			/* they're sending us a ping request */
			struct lws_h2_protocol_send *pps =
					lws_h2_new_pps(LWS_H2_PPS_PONG);
			if (!pps)
				return 1;

			lwsl_info("rx ping, preparing pong\n");

			memcpy(pps->u.ping.ping_payload, h2n->ping_payload, 8);
			lws_pps_schedule(wsi, pps);
		}

		break;

	case LWS_H2_FRAME_TYPE_WINDOW_UPDATE:
		/*
		 * We only have an unsigned 31-bit (positive) increment possible
		 */
		h2n->hpack_e_dep &= ~(1u << 31);
		lwsl_info("WINDOW_UPDATE: sid %u %u (0x%x)\n",
			  (unsigned int)h2n->sid,
			  (unsigned int)h2n->hpack_e_dep,
			  (unsigned int)h2n->hpack_e_dep);

		if (h2n->sid)
			eff_wsi = h2n->swsi;

		if (!eff_wsi) {
			if (h2n->sid > h2n->highest_sid_opened)
				lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
					      "alien sid");
			break; /* ignore */
		}

		if (eff_wsi->vhost->options &
		        LWS_SERVER_OPTION_H2_JUST_FIX_WINDOW_UPDATE_OVERFLOW &&
		    (uint64_t)eff_wsi->txc.tx_cr + (uint64_t)h2n->hpack_e_dep >
		    (uint64_t)0x7fffffff)
			h2n->hpack_e_dep = 0x7fffffff - eff_wsi->txc.tx_cr;

		if ((uint64_t)eff_wsi->txc.tx_cr + (uint64_t)h2n->hpack_e_dep >
		    (uint64_t)0x7fffffff) {
			if (h2n->sid)
				lws_h2_rst_stream(h2n->swsi,
						  H2_ERR_FLOW_CONTROL_ERROR,
						  "Flow control exceeded max");
			else
				lws_h2_goaway(wsi, H2_ERR_FLOW_CONTROL_ERROR,
					      "Flow control exceeded max");
			break;
		}

		if (!h2n->hpack_e_dep) {
			lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
				      "Zero length window update");
			break;
		}
		n = eff_wsi->txc.tx_cr;
		eff_wsi->txc.tx_cr += h2n->hpack_e_dep;

		lws_wsi_txc_report_manual_txcr_in(eff_wsi,
						  (int32_t)h2n->hpack_e_dep);

		lws_wsi_txc_describe(&eff_wsi->txc, "WINDOW_UPDATE in",
				     eff_wsi->mux.my_sid);

		if (n <= 0 && eff_wsi->txc.tx_cr <= 0)
			/* it helps, but won't change sendability for anyone */
			break;

		/*
		 * It may have changed sendability (depends on SID 0 tx credit
		 * too)... for us and any children waiting on us... reassess
		 * blockage for all children first
		 */
		lws_start_foreach_ll(struct lws *, w, wsi->mux.child_list) {
			lws_callback_on_writable(w);
		} lws_end_foreach_ll(w, mux.sibling_list);

		if (eff_wsi->txc.skint &&
		    !lws_wsi_txc_check_skint(&eff_wsi->txc,
					     lws_h2_tx_cr_get(eff_wsi)))
			/*
			 * This one became un-skint, schedule a writeable
			 * callback
			 */
			lws_callback_on_writable(eff_wsi);

		break;

	case LWS_H2_FRAME_TYPE_GOAWAY:
		lwsl_notice("GOAWAY: last sid %u, error 0x%08X, string '%s'\n",
			  (unsigned int)h2n->goaway_last_sid,
			  (unsigned int)h2n->goaway_err, h2n->goaway_str);

		return 1;

	case LWS_H2_FRAME_TYPE_RST_STREAM:
		lwsl_info("LWS_H2_FRAME_TYPE_RST_STREAM: sid %u: reason 0x%x\n",
			  (unsigned int)h2n->sid,
			  (unsigned int)h2n->hpack_e_dep);
		break;

	case LWS_H2_FRAME_TYPE_COUNT: /* IGNORING FRAME */
		break;
	}

	return 0;
}